

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O1

idx_t duckdb::ListSearchOp<true>
                (Vector *list_v,Vector *source_v,Vector *target_v,Vector *result_v,
                idx_t target_count)

{
  PhysicalType PVar1;
  idx_t iVar2;
  NotImplementedException *this;
  PhysicalType type;
  string local_60;
  string local_40;
  
  PVar1 = (target_v->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
    case INT8:
      iVar2 = ListSearchSimpleOp<signed_char,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case UINT8:
      iVar2 = ListSearchSimpleOp<unsigned_char,true>(list_v,source_v,target_v,result_v,target_count)
      ;
      return iVar2;
    case UINT16:
      iVar2 = ListSearchSimpleOp<unsigned_short,true>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case INT16:
      iVar2 = ListSearchSimpleOp<short,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case UINT32:
      iVar2 = ListSearchSimpleOp<unsigned_int,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case INT32:
      iVar2 = ListSearchSimpleOp<int,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case UINT64:
      iVar2 = ListSearchSimpleOp<unsigned_long,true>(list_v,source_v,target_v,result_v,target_count)
      ;
      return iVar2;
    case INT64:
      iVar2 = ListSearchSimpleOp<long,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case FLOAT:
      iVar2 = ListSearchSimpleOp<float,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case DOUBLE:
      iVar2 = ListSearchSimpleOp<double,true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case INTERVAL:
      iVar2 = ListSearchSimpleOp<duckdb::interval_t,true>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    case LIST:
    case STRUCT:
    case ARRAY:
      iVar2 = ListSearchNestedOp<true>(list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
  }
  else {
    if (PVar1 == VARCHAR) {
      iVar2 = ListSearchSimpleOp<duckdb::string_t,true>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
    if (PVar1 == UINT128) {
      iVar2 = ListSearchSimpleOp<duckdb::uhugeint_t,true>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
    if (PVar1 == INT128) {
      iVar2 = ListSearchSimpleOp<duckdb::hugeint_t,true>
                        (list_v,source_v,target_v,result_v,target_count);
      return iVar2;
    }
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"This function has not been implemented for logical type %s","");
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)(ulong)PVar1,type);
  NotImplementedException::NotImplementedException<std::__cxx11::string>(this,&local_60,&local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t ListSearchOp(Vector &list_v, Vector &source_v, Vector &target_v, Vector &result_v, idx_t target_count) {
	const auto type = target_v.GetType().InternalType();
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return ListSearchSimpleOp<int8_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT16:
		return ListSearchSimpleOp<int16_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT32:
		return ListSearchSimpleOp<int32_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT64:
		return ListSearchSimpleOp<int64_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INT128:
		return ListSearchSimpleOp<hugeint_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT8:
		return ListSearchSimpleOp<uint8_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT16:
		return ListSearchSimpleOp<uint16_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT32:
		return ListSearchSimpleOp<uint32_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT64:
		return ListSearchSimpleOp<uint64_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::UINT128:
		return ListSearchSimpleOp<uhugeint_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::FLOAT:
		return ListSearchSimpleOp<float, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::DOUBLE:
		return ListSearchSimpleOp<double, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::VARCHAR:
		return ListSearchSimpleOp<string_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::INTERVAL:
		return ListSearchSimpleOp<interval_t, RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return ListSearchNestedOp<RETURN_POSITION>(list_v, source_v, target_v, result_v, target_count);
	default:
		throw NotImplementedException("This function has not been implemented for logical type %s",
		                              TypeIdToString(type));
	}
}